

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O3

uint8_t gb_read_joypad_input(MemoryBankController *mc)

{
  uint8_t uVar1;
  
  if ((mc->memory[0xff00] & 0x20) == 0) {
    return mc->buttons >> 4;
  }
  uVar1 = 0xff;
  if ((mc->memory[0xff00] & 0x10) == 0) {
    uVar1 = mc->buttons;
  }
  return uVar1;
}

Assistant:

uint8_t gb_read_joypad_input(MemoryBankController* mc) {

    uint8_t data = mc->memory[JOYP];

    if ( !(data & Action_Button)) {
        return (mc->buttons >> 4) & 0x0F;
    }

    if ( !(data & Direction_Button)) {
        return mc->buttons & 0xFF;
    }

    return 0xFF;
}